

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3FkCheck(Parse *pParse,Table *pTab,int regOld,int regNew,int *aChange,int bChngRowid)

{
  u8 uVar1;
  byte bVar2;
  sqlite3 *db;
  char *zDbase;
  Trigger *pTVar3;
  u64 uVar4;
  Index *pIdx_00;
  i16 iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Table *pTVar9;
  Vdbe *p;
  i16 *piVar10;
  FKey *pFVar11;
  SrcList *pSrc;
  Parse *pPVar12;
  long lVar13;
  int *aiCol;
  long lVar14;
  uint isIgnore;
  sColMap *psVar15;
  long in_FS_OFFSET;
  int iCol;
  int *aiFree;
  Index *pIdx;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  db = pParse->db;
  if (((db->flags & 0x4000) != 0) && (pTab->eTabType == '\0')) {
    uVar1 = pParse->disableTriggers;
    iVar6 = sqlite3SchemaToIndex(db,pTab->pSchema);
    zDbase = db->aDb[iVar6].zDbSName;
    pFVar11 = (FKey *)&pTab->u;
    while (pFVar11 = pFVar11->pNextFrom, pFVar11 != (FKey *)0x0) {
      pIdx = (Index *)0x0;
      aiFree = (int *)0x0;
      iCol = -0x55555556;
      if (((aChange == (int *)0x0) ||
          (iVar7 = sqlite3_stricmp(pTab->zName,pFVar11->zTo), iVar7 == 0)) ||
         (iVar7 = fkChildIsModified(pTab,pFVar11,aChange,bChngRowid), iVar7 != 0)) {
        if (pParse->disableTriggers == '\0') {
          pTVar9 = sqlite3LocateTable(pParse,0,pFVar11->zTo,zDbase);
        }
        else {
          pTVar9 = sqlite3FindTable(db,pFVar11->zTo,zDbase);
        }
        if ((pTVar9 == (Table *)0x0) ||
           (iVar7 = sqlite3FkLocateIndex(pParse,pTVar9,pFVar11,&pIdx,&aiFree), pIdx_00 = pIdx,
           iVar7 != 0)) {
          if ((uVar1 == '\0') || (db->mallocFailed != '\0')) goto LAB_0019354a;
          if (pTVar9 == (Table *)0x0) {
            p = sqlite3GetVdbe(pParse);
            iVar8 = pFVar11->nCol;
            iVar7 = p->nOp + iVar8;
            psVar15 = pFVar11->aCol;
            for (lVar13 = 0; lVar13 < iVar8; lVar13 = lVar13 + 1) {
              iVar5 = sqlite3TableColumnToStorage(pFVar11->pFrom,(i16)psVar15->iFrom);
              sqlite3VdbeAddOp2(p,0x33,(int)iVar5 + regOld + 1,iVar7 + 1);
              iVar8 = pFVar11->nCol;
              psVar15 = psVar15 + 1;
            }
            sqlite3VdbeAddOp2(p,0x9e,(uint)pFVar11->isDeferred,-1);
          }
        }
        else {
          aiCol = aiFree;
          if (aiFree == (int *)0x0) {
            iCol = pFVar11->aCol[0].iFrom;
            aiCol = &iCol;
          }
          lVar13 = 0;
          isIgnore = 0;
          for (lVar14 = 0; lVar14 < pFVar11->nCol; lVar14 = lVar14 + 1) {
            if (*(int *)((long)aiCol + lVar13 * 2) == (int)pTab->iPKey) {
              *(undefined4 *)((long)aiCol + lVar13 * 2) = 0xffffffff;
            }
            if (db->xAuth != (sqlite3_xauth)0x0) {
              piVar10 = &pTVar9->iPKey;
              if (pIdx_00 != (Index *)0x0) {
                piVar10 = (i16 *)((long)pIdx_00->aiColumn + lVar13);
              }
              iVar7 = sqlite3AuthReadCol(pParse,pTVar9->zName,pTVar9->aCol[*piVar10].zCnName,iVar6);
              isIgnore = (uint)(iVar7 == 2);
            }
            lVar13 = lVar13 + 2;
          }
          sqlite3TableLock(pParse,iVar6,pTVar9->tnum,'\0',pTVar9->zName);
          pParse->nTab = pParse->nTab + 1;
          if (regOld != 0) {
            fkLookupParent(pParse,iVar6,pTVar9,pIdx_00,pFVar11,aiCol,regOld,-1,isIgnore);
          }
          if (regNew != 0) {
            pPVar12 = pParse->pToplevel;
            if (pParse->pToplevel == (Parse *)0x0) {
              pPVar12 = pParse;
            }
            if ((pPVar12->pTriggerPrg == (TriggerPrg *)0x0) ||
               (((pTVar3 = pPVar12->pTriggerPrg->pTrigger, pTVar3 != pFVar11->apTrigger[0] ||
                 (pFVar11->aAction[0] != '\b')) &&
                ((pTVar3 != pFVar11->apTrigger[1] || (pFVar11->aAction[1] != '\b')))))) {
              fkLookupParent(pParse,iVar6,pTVar9,pIdx_00,pFVar11,aiCol,regNew,1,isIgnore);
            }
          }
          sqlite3DbFree(db,aiFree);
        }
      }
    }
    pFVar11 = sqlite3FkReferences(pTab);
    for (; pFVar11 != (FKey *)0x0; pFVar11 = pFVar11->pNextTo) {
      pIdx = (Index *)0x0;
      aiFree = (int *)0x0;
      if (((aChange == (int *)0x0) ||
          (iVar6 = fkParentIsModified(pTab,pFVar11,aChange,bChngRowid), iVar6 != 0)) &&
         ((pFVar11->isDeferred != '\0' ||
          ((((db->flags & 0x80000) != 0 || (pParse->pToplevel != (Parse *)0x0)) ||
           (pParse->isMultiWrite != '\0')))))) {
        iVar6 = sqlite3FkLocateIndex(pParse,pTab,pFVar11,&pIdx,&aiFree);
        if (iVar6 == 0) {
          pSrc = sqlite3SrcListAppend(pParse,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
          if (pSrc != (SrcList *)0x0) {
            pTVar9 = pFVar11->pFrom;
            pSrc->a[0].pSTab = pTVar9;
            pSrc->a[0].zName = pTVar9->zName;
            pTVar9->nTabRef = pTVar9->nTabRef + 1;
            iVar6 = pParse->nTab;
            pParse->nTab = iVar6 + 1;
            pSrc->a[0].iCursor = iVar6;
            if (regNew != 0) {
              fkScanChildren(pParse,pSrc,pTab,pIdx,pFVar11,aiFree,regNew,-1);
            }
            if (regOld != 0) {
              bVar2 = pFVar11->aAction[aChange != (int *)0x0];
              uVar4 = db->flags;
              fkScanChildren(pParse,pSrc,pTab,pIdx,pFVar11,aiFree,regOld,1);
              if ((pFVar11->isDeferred == '\0') &&
                 (((uint)(uVar4 >> 0x23) & 1) != 0 || (bVar2 & 0xfd) != 8)) {
                pPVar12 = pParse->pToplevel;
                if (pParse->pToplevel == (Parse *)0x0) {
                  pPVar12 = pParse;
                }
                pPVar12->mayAbort = '\x01';
              }
            }
            pSrc->a[0].zName = (char *)0x0;
            sqlite3SrcListDelete(db,pSrc);
          }
          sqlite3DbFree(db,aiFree);
        }
        else if ((uVar1 == '\0') || (db->mallocFailed != '\0')) break;
      }
    }
  }
LAB_0019354a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3FkCheck(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Row is being deleted from this table */
  int regOld,                     /* Previous row data is stored here */
  int regNew,                     /* New row data is stored here */
  int *aChange,                   /* Array indicating UPDATEd columns (or 0) */
  int bChngRowid                  /* True if rowid is UPDATEd */
){
  sqlite3 *db = pParse->db;       /* Database handle */
  FKey *pFKey;                    /* Used to iterate through FKs */
  int iDb;                        /* Index of database containing pTab */
  const char *zDb;                /* Name of database containing pTab */
  int isIgnoreErrors = pParse->disableTriggers;

  /* Exactly one of regOld and regNew should be non-zero. */
  assert( (regOld==0)!=(regNew==0) );

  /* If foreign-keys are disabled, this function is a no-op. */
  if( (db->flags&SQLITE_ForeignKeys)==0 ) return;
  if( !IsOrdinaryTable(pTab) ) return;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  zDb = db->aDb[iDb].zDbSName;

  /* Loop through all the foreign key constraints for which pTab is the
  ** child table (the table that the foreign key definition is part of).  */
  for(pFKey=pTab->u.tab.pFKey; pFKey; pFKey=pFKey->pNextFrom){
    Table *pTo;                   /* Parent table of foreign key pFKey */
    Index *pIdx = 0;              /* Index on key columns in pTo */
    int *aiFree = 0;
    int *aiCol;
    int iCol;
    int i;
    int bIgnore = 0;

    if( aChange
     && sqlite3_stricmp(pTab->zName, pFKey->zTo)!=0
     && fkChildIsModified(pTab, pFKey, aChange, bChngRowid)==0
    ){
      continue;
    }

    /* Find the parent table of this foreign key. Also find a unique index
    ** on the parent key columns in the parent table. If either of these
    ** schema items cannot be located, set an error in pParse and return
    ** early.  */
    if( pParse->disableTriggers ){
      pTo = sqlite3FindTable(db, pFKey->zTo, zDb);
    }else{
      pTo = sqlite3LocateTable(pParse, 0, pFKey->zTo, zDb);
    }
    if( !pTo || sqlite3FkLocateIndex(pParse, pTo, pFKey, &pIdx, &aiFree) ){
      assert( isIgnoreErrors==0 || (regOld!=0 && regNew==0) );
      if( !isIgnoreErrors || db->mallocFailed ) return;
      if( pTo==0 ){
        /* If isIgnoreErrors is true, then a table is being dropped. In this
        ** case SQLite runs a "DELETE FROM xxx" on the table being dropped
        ** before actually dropping it in order to check FK constraints.
        ** If the parent table of an FK constraint on the current table is
        ** missing, behave as if it is empty. i.e. decrement the relevant
        ** FK counter for each row of the current table with non-NULL keys.
        */
        Vdbe *v = sqlite3GetVdbe(pParse);
        int iJump = sqlite3VdbeCurrentAddr(v) + pFKey->nCol + 1;
        for(i=0; i<pFKey->nCol; i++){
          int iFromCol, iReg;
          iFromCol = pFKey->aCol[i].iFrom;
          iReg = sqlite3TableColumnToStorage(pFKey->pFrom,iFromCol) + regOld+1;
          sqlite3VdbeAddOp2(v, OP_IsNull, iReg, iJump); VdbeCoverage(v);
        }
        sqlite3VdbeAddOp2(v, OP_FkCounter, pFKey->isDeferred, -1);
      }
      continue;
    }
    assert( pFKey->nCol==1 || (aiFree && pIdx) );

    if( aiFree ){
      aiCol = aiFree;
    }else{
      iCol = pFKey->aCol[0].iFrom;
      aiCol = &iCol;
    }
    for(i=0; i<pFKey->nCol; i++){
      if( aiCol[i]==pTab->iPKey ){
        aiCol[i] = -1;
      }
      assert( pIdx==0 || pIdx->aiColumn[i]>=0 );
#ifndef SQLITE_OMIT_AUTHORIZATION
      /* Request permission to read the parent key columns. If the
      ** authorization callback returns SQLITE_IGNORE, behave as if any
      ** values read from the parent table are NULL. */
      if( db->xAuth ){
        int rcauth;
        char *zCol = pTo->aCol[pIdx ? pIdx->aiColumn[i] : pTo->iPKey].zCnName;
        rcauth = sqlite3AuthReadCol(pParse, pTo->zName, zCol, iDb);
        bIgnore = (rcauth==SQLITE_IGNORE);
      }
#endif
    }

    /* Take a shared-cache advisory read-lock on the parent table. Allocate
    ** a cursor to use to search the unique index on the parent key columns
    ** in the parent table.  */
    sqlite3TableLock(pParse, iDb, pTo->tnum, 0, pTo->zName);
    pParse->nTab++;

    if( regOld!=0 ){
      /* A row is being removed from the child table. Search for the parent.
      ** If the parent does not exist, removing the child row resolves an
      ** outstanding foreign key constraint violation. */
      fkLookupParent(pParse, iDb, pTo, pIdx, pFKey, aiCol, regOld, -1, bIgnore);
    }
    if( regNew!=0 && !isSetNullAction(pParse, pFKey) ){
      /* A row is being added to the child table. If a parent row cannot
      ** be found, adding the child row has violated the FK constraint.
      **
      ** If this operation is being performed as part of a trigger program
      ** that is actually a "SET NULL" action belonging to this very
      ** foreign key, then omit this scan altogether. As all child key
      ** values are guaranteed to be NULL, it is not possible for adding
      ** this row to cause an FK violation.  */
      fkLookupParent(pParse, iDb, pTo, pIdx, pFKey, aiCol, regNew, +1, bIgnore);
    }

    sqlite3DbFree(db, aiFree);
  }

  /* Loop through all the foreign key constraints that refer to this table.
  ** (the "child" constraints) */
  for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
    Index *pIdx = 0;              /* Foreign key index for pFKey */
    SrcList *pSrc;
    int *aiCol = 0;

    if( aChange && fkParentIsModified(pTab, pFKey, aChange, bChngRowid)==0 ){
      continue;
    }

    if( !pFKey->isDeferred && !(db->flags & SQLITE_DeferFKs)
     && !pParse->pToplevel && !pParse->isMultiWrite
    ){
      assert( regOld==0 && regNew!=0 );
      /* Inserting a single row into a parent table cannot cause (or fix)
      ** an immediate foreign key violation. So do nothing in this case.  */
      continue;
    }

    if( sqlite3FkLocateIndex(pParse, pTab, pFKey, &pIdx, &aiCol) ){
      if( !isIgnoreErrors || db->mallocFailed ) return;
      continue;
    }
    assert( aiCol || pFKey->nCol==1 );

    /* Create a SrcList structure containing the child table.  We need the
    ** child table as a SrcList for sqlite3WhereBegin() */
    pSrc = sqlite3SrcListAppend(pParse, 0, 0, 0);
    if( pSrc ){
      SrcItem *pItem = pSrc->a;
      pItem->pSTab = pFKey->pFrom;
      pItem->zName = pFKey->pFrom->zName;
      pItem->pSTab->nTabRef++;
      pItem->iCursor = pParse->nTab++;

      if( regNew!=0 ){
        fkScanChildren(pParse, pSrc, pTab, pIdx, pFKey, aiCol, regNew, -1);
      }
      if( regOld!=0 ){
        int eAction = pFKey->aAction[aChange!=0];
        if( (db->flags & SQLITE_FkNoAction) ) eAction = OE_None;

        fkScanChildren(pParse, pSrc, pTab, pIdx, pFKey, aiCol, regOld, 1);
        /* If this is a deferred FK constraint, or a CASCADE or SET NULL
        ** action applies, then any foreign key violations caused by
        ** removing the parent key will be rectified by the action trigger.
        ** So do not set the "may-abort" flag in this case.
        **
        ** Note 1: If the FK is declared "ON UPDATE CASCADE", then the
        ** may-abort flag will eventually be set on this statement anyway
        ** (when this function is called as part of processing the UPDATE
        ** within the action trigger).
        **
        ** Note 2: At first glance it may seem like SQLite could simply omit
        ** all OP_FkCounter related scans when either CASCADE or SET NULL
        ** applies. The trouble starts if the CASCADE or SET NULL action
        ** trigger causes other triggers or action rules attached to the
        ** child table to fire. In these cases the fk constraint counters
        ** might be set incorrectly if any OP_FkCounter related scans are
        ** omitted.  */
        if( !pFKey->isDeferred && eAction!=OE_Cascade && eAction!=OE_SetNull ){
          sqlite3MayAbort(pParse);
        }
      }
      pItem->zName = 0;
      sqlite3SrcListDelete(db, pSrc);
    }
    sqlite3DbFree(db, aiCol);
  }
}